

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_DBIStream.cpp
# Opt level: O0

ErrorCode __thiscall PDB::DBIStream::HasValidGlobalSymbolStream(DBIStream *this,RawFile *file)

{
  HashTableHeader HVar1;
  uint32_t local_50;
  uint32_t uStack_4c;
  HashTableHeader hashHeader;
  DirectMSFStream globalStream;
  RawFile *file_local;
  DBIStream *this_local;
  
  RawFile::CreateMSFStream<PDB::DirectMSFStream>
            ((DirectMSFStream *)&hashHeader.size,file,(uint)(this->m_header).globalStreamIndex);
  HVar1 = DirectMSFStream::ReadAtOffset<PDB::HashTableHeader>((DirectMSFStream *)&hashHeader.size,0)
  ;
  local_50 = HVar1.signature;
  if (local_50 == 0xffffffff) {
    uStack_4c = HVar1.version;
    if (uStack_4c == 0xf12f091a) {
      this_local._4_4_ = Success;
    }
    else {
      this_local._4_4_ = UnknownVersion;
    }
  }
  else {
    this_local._4_4_ = InvalidSignature;
  }
  return this_local._4_4_;
}

Assistant:

PDB_NO_DISCARD PDB::ErrorCode PDB::DBIStream::HasValidGlobalSymbolStream(const RawFile& file) const PDB_NO_EXCEPT
{
	DirectMSFStream globalStream = file.CreateMSFStream<DirectMSFStream>(m_header.globalStreamIndex);

	// the global symbol stream starts with a hash table header
	const HashTableHeader hashHeader = globalStream.ReadAtOffset<HashTableHeader>(0u);
	if (hashHeader.signature != HashTableHeader::Signature)
	{
		return ErrorCode::InvalidSignature;
	}
	else if (hashHeader.version != HashTableHeader::Version)
	{
		return ErrorCode::UnknownVersion;
	}

	return ErrorCode::Success;
}